

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

string * __thiscall
testing::internal::ExitSummary_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,int exit_code)

{
  Message *pMVar1;
  uint local_34;
  uint local_30 [4];
  Message local_20;
  Message m;
  int exit_code_local;
  
  m.ss_.ptr_._4_4_ = (uint)this;
  Message::Message(&local_20);
  if ((m.ss_.ptr_._4_4_ & 0x7f) == 0) {
    pMVar1 = Message::operator<<(&local_20,(char (*) [25])"Exited with exit status ");
    local_30[0] = m.ss_.ptr_._4_4_ >> 8 & 0xff;
    Message::operator<<(pMVar1,(int *)local_30);
  }
  else if ('\0' < (char)(((byte)m.ss_.ptr_._4_4_ & 0x7f) + 1) >> 1) {
    pMVar1 = Message::operator<<(&local_20,(char (*) [22])"Terminated by signal ");
    local_34 = m.ss_.ptr_._4_4_ & 0x7f;
    Message::operator<<(pMVar1,(int *)&local_34);
  }
  if ((m.ss_.ptr_._4_4_ & 0x80) != 0) {
    Message::operator<<(&local_20,(char (*) [15])" (core dumped)");
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,&local_20);
  Message::~Message(&local_20);
  return __return_storage_ptr__;
}

Assistant:

static std::string ExitSummary(int exit_code) {
  Message m;

# if GTEST_OS_WINDOWS || GTEST_OS_FUCHSIA

  m << "Exited with exit status " << exit_code;

# else

  if (WIFEXITED(exit_code)) {
    m << "Exited with exit status " << WEXITSTATUS(exit_code);
  } else if (WIFSIGNALED(exit_code)) {
    m << "Terminated by signal " << WTERMSIG(exit_code);
  }
#  ifdef WCOREDUMP
  if (WCOREDUMP(exit_code)) {
    m << " (core dumped)";
  }
#  endif
# endif  // GTEST_OS_WINDOWS || GTEST_OS_FUCHSIA

  return m.GetString();
}